

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cc
# Opt level: O0

auto_ptr<avro::InputStream> avro::fileInputStream(char *filename,size_t bufferSize)

{
  element_type *__p;
  auto_ptr<avro::(anonymous_namespace)::BufferCopyIn> *this;
  auto_ptr<avro::InputStream> *in_RDI;
  auto_ptr<avro::(anonymous_namespace)::BufferCopyIn> in;
  char *in_stack_000000c8;
  FileBufferCopyIn *in_stack_000000d0;
  size_t in_stack_ffffffffffffffd0;
  auto_ptr<avro::(anonymous_namespace)::BufferCopyIn> *in_stack_ffffffffffffffd8;
  auto_ptr<avro::(anonymous_namespace)::BufferCopyIn> in_stack_ffffffffffffffe0;
  
  __p = (element_type *)operator_new(0x10);
  anon_unknown_3::FileBufferCopyIn::FileBufferCopyIn(in_stack_000000d0,in_stack_000000c8);
  std::auto_ptr<avro::(anonymous_namespace)::BufferCopyIn>::auto_ptr
            ((auto_ptr<avro::(anonymous_namespace)::BufferCopyIn> *)&stack0xffffffffffffffe0,__p);
  this = (auto_ptr<avro::(anonymous_namespace)::BufferCopyIn> *)operator_new(0x38);
  BufferCopyInInputStream::BufferCopyInInputStream
            ((BufferCopyInInputStream *)in_stack_ffffffffffffffe0._M_ptr,in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd0);
  std::auto_ptr<avro::InputStream>::auto_ptr(in_RDI,(element_type *)this);
  std::auto_ptr<avro::(anonymous_namespace)::BufferCopyIn>::~auto_ptr(this);
  return (auto_ptr<avro::InputStream>)(InputStream *)in_RDI;
}

Assistant:

auto_ptr<InputStream> fileInputStream(const char* filename,
    size_t bufferSize)
{
    auto_ptr<BufferCopyIn> in(new FileBufferCopyIn(filename));
    return auto_ptr<InputStream>( new BufferCopyInInputStream(in, bufferSize));
}